

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lottieitem.cpp
# Opt level: O0

void __thiscall
rlottie::internal::renderer::Shape::update
          (Shape *this,int frameNo,VMatrix *param_3,float param_4,DirtyFlag *flag)

{
  bool bVar1;
  Int IVar2;
  undefined4 in_ESI;
  VPath *in_RDI;
  VPath *in_stack_ffffffffffffffb8;
  undefined4 in_stack_ffffffffffffffc8;
  undefined4 in_stack_ffffffffffffffcc;
  undefined1 local_30 [36];
  undefined4 local_c;
  
  *(undefined1 *)((long)&in_RDI[4].d.mModel + 4) = 0;
  local_c = in_ESI;
  bVar1 = hasChanged((Shape *)CONCAT44(in_stack_ffffffffffffffcc,in_stack_ffffffffffffffc8),
                     (int)((ulong)in_RDI >> 0x20));
  if (bVar1) {
    memset(local_30,0,8);
    VPath::VPath((VPath *)0x163265);
    VPath::operator=(in_RDI,in_stack_ffffffffffffffb8);
    VPath::~VPath((VPath *)0x163282);
    (*(code *)(((in_RDI->d).mModel)->mValue).m_elements.
              super__Vector_base<VPath::Element,_std::allocator<VPath::Element>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage)(in_RDI,in_RDI + 2,local_c);
    *(undefined1 *)((long)&in_RDI[4].d.mModel + 4) = 1;
  }
  VPath::operator=(in_RDI,in_stack_ffffffffffffffb8);
  vFlag<rlottie::internal::renderer::DirtyFlagBit>::operator&
            ((vFlag<rlottie::internal::renderer::DirtyFlagBit> *)in_stack_ffffffffffffffb8,None);
  IVar2 = vFlag::operator_cast_to_unsigned_int((vFlag *)&stack0xffffffffffffffcc);
  if (IVar2 != 0) {
    *(undefined1 *)((long)&in_RDI[4].d.mModel + 4) = 1;
  }
  return;
}

Assistant:

void renderer::Shape::update(int              frameNo, const VMatrix &, float,
                             const DirtyFlag &flag)
{
    mDirtyPath = false;

    // 1. update the local path if needed
    if (hasChanged(frameNo)) {
        // loose the reference to mLocalPath if any
        // from the last frame update.
        mTemp = VPath();

        updatePath(mLocalPath, frameNo);
        mDirtyPath = true;
    }
    // 2. keep a reference path in temp in case there is some
    // path operation like trim which will update the path.
    // we don't want to update the local path.
    mTemp = mLocalPath;

    // 3. mark the path dirty if matrix has changed.
    if (flag & DirtyFlagBit::Matrix) {
        mDirtyPath = true;
    }
}